

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

int Ivy_HaigObjCountClass(Ivy_Obj_t *pObj)

{
  int iVar1;
  int local_24;
  Ivy_Obj_t *pIStack_20;
  int Counter;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                  ,0x44,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjRefs(pObj);
  if (0 < iVar1) {
    if (pObj->pEquiv == (Ivy_Obj_t *)0x0) {
      pObj_local._4_4_ = 1;
    }
    else {
      iVar1 = Ivy_IsComplement(pObj->pEquiv);
      if (iVar1 != 0) {
        __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                      ,0x48,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
      }
      local_24 = 1;
      for (pIStack_20 = pObj->pEquiv; pIStack_20 != pObj;
          pIStack_20 = Ivy_Regular(pIStack_20->pEquiv)) {
        local_24 = local_24 + 1;
      }
      pObj_local._4_4_ = local_24;
    }
    return pObj_local._4_4_;
  }
  __assert_fail("Ivy_ObjRefs(pObj) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyHaig.c"
                ,0x45,"int Ivy_HaigObjCountClass(Ivy_Obj_t *)");
}

Assistant:

static inline int Ivy_HaigObjCountClass( Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pTemp;
    int Counter;
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjRefs(pObj) > 0 );
    if ( pObj->pEquiv == NULL )
        return 1;
    assert( !Ivy_IsComplement(pObj->pEquiv) );
    Counter = 1;
    for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        Counter++;
    return Counter;
}